

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O3

LY_ERR lys_find_xpath(ly_ctx *ctx,lysc_node *ctx_node,char *xpath,uint32_t options,ly_set **set)

{
  ly_ctx *plVar1;
  LY_ERR LVar2;
  uint32_t uVar3;
  lyd_node **pplVar4;
  char *pcVar5;
  ulong uVar6;
  long lVar7;
  lyxp_expr *exp;
  ulong local_d0;
  lyxp_set xp_set;
  
  memset(&xp_set,0,0x90);
  exp = (lyxp_expr *)0x0;
  if (ctx == (ly_ctx *)0x0 && ctx_node == (lysc_node *)0x0) {
    pcVar5 = "ctx || ctx_node";
  }
  else if (xpath == (char *)0x0) {
    pcVar5 = "xpath";
  }
  else {
    if (set != (ly_set **)0x0) {
      if (ctx == (ly_ctx *)0x0 || ctx_node == (lysc_node *)0x0) {
        local_d0 = 4;
        if ((options & 0x1c) != 0) {
          local_d0 = (ulong)options;
        }
        if (ctx == (ly_ctx *)0x0) {
          ctx = ctx_node->module->ctx;
        }
      }
      else {
        plVar1 = ctx_node->module->ctx;
        if (plVar1 != (ly_ctx *)0x0 && plVar1 != ctx) {
          ly_log(ctx,LY_LLERR,LY_EINVAL,"Different contexts mixed in a single function call.");
          return LY_EINVAL;
        }
        local_d0 = 4;
        if ((options & 0x1c) != 0) {
          local_d0 = (ulong)options;
        }
      }
      LVar2 = ly_set_new(set);
      if (((LVar2 == LY_SUCCESS) &&
          (LVar2 = lyxp_expr_parse(ctx,xpath,0,'\x01',&exp), LVar2 == LY_SUCCESS)) &&
         (LVar2 = lyxp_atomize(ctx,exp,(lys_module *)0x0,LY_VALUE_JSON,(void *)0x0,ctx_node,ctx_node
                               ,&xp_set,(uint32_t)local_d0), LVar2 == LY_SUCCESS)) {
        pplVar4 = (lyd_node **)malloc((ulong)xp_set.used << 3);
        ((*set)->field_2).dnodes = pplVar4;
        if (((*set)->field_2).dnodes == (lyd_node **)0x0) {
          LVar2 = LY_EMEM;
          ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_find_xpath");
        }
        else {
          (*set)->size = xp_set.used;
          if (xp_set.used == 0) {
            LVar2 = LY_SUCCESS;
          }
          else {
            lVar7 = 0xc;
            uVar6 = 0;
            uVar3 = xp_set.used;
            do {
              if (((*(int *)((long)xp_set.val.nodes + lVar7 + -4) == 3) &&
                  (*(int *)((long)&(xp_set.val.nodes)->node + lVar7) == 2)) &&
                 (LVar2 = ly_set_add(*set,*(void **)((long)xp_set.val.nodes + lVar7 + -0xc),'\x01',
                                     (uint32_t *)0x0), uVar3 = xp_set.used, LVar2 != LY_SUCCESS))
              break;
              uVar6 = uVar6 + 1;
              lVar7 = lVar7 + 0x18;
              LVar2 = LY_SUCCESS;
            } while (uVar6 < uVar3);
          }
        }
      }
      lyxp_set_free_content(&xp_set);
      lyxp_expr_free(ctx,exp);
      if (LVar2 != LY_SUCCESS) {
        ly_set_free(*set,(_func_void_void_ptr *)0x0);
        *set = (ly_set *)0x0;
        return LVar2;
      }
      return LY_SUCCESS;
    }
    pcVar5 = "set";
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar5,"lys_find_xpath");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lys_find_xpath(const struct ly_ctx *ctx, const struct lysc_node *ctx_node, const char *xpath, uint32_t options,
        struct ly_set **set)
{
    LY_ERR ret = LY_SUCCESS;
    struct lyxp_set xp_set = {0};
    struct lyxp_expr *exp = NULL;
    uint32_t i;

    LY_CHECK_ARG_RET(NULL, ctx || ctx_node, xpath, set, LY_EINVAL);
    LY_CHECK_CTX_EQUAL_RET(ctx, ctx_node ? ctx_node->module->ctx : NULL, LY_EINVAL);
    if (!(options & LYXP_SCNODE_ALL)) {
        options = LYXP_SCNODE;
    }
    if (!ctx) {
        ctx = ctx_node->module->ctx;
    }

    /* allocate return set */
    ret = ly_set_new(set);
    LY_CHECK_GOTO(ret, cleanup);

    /* compile expression */
    ret = lyxp_expr_parse(ctx, xpath, 0, 1, &exp);
    LY_CHECK_GOTO(ret, cleanup);

    /* atomize expression */
    ret = lyxp_atomize(ctx, exp, NULL, LY_VALUE_JSON, NULL, ctx_node, ctx_node, &xp_set, options);
    LY_CHECK_GOTO(ret, cleanup);

    /* transform into ly_set */
    (*set)->objs = malloc(xp_set.used * sizeof *(*set)->objs);
    LY_CHECK_ERR_GOTO(!(*set)->objs, LOGMEM(ctx); ret = LY_EMEM, cleanup);
    (*set)->size = xp_set.used;

    for (i = 0; i < xp_set.used; ++i) {
        if ((xp_set.val.scnodes[i].type == LYXP_NODE_ELEM) && (xp_set.val.scnodes[i].in_ctx == LYXP_SET_SCNODE_ATOM_CTX)) {
            ret = ly_set_add(*set, xp_set.val.scnodes[i].scnode, 1, NULL);
            LY_CHECK_GOTO(ret, cleanup);
        }
    }

cleanup:
    lyxp_set_free_content(&xp_set);
    lyxp_expr_free(ctx, exp);
    if (ret) {
        ly_set_free(*set, NULL);
        *set = NULL;
    }
    return ret;
}